

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  RTPTime RStack_10930;
  RTPTime RStack_10928;
  RTPPacket *pRStack_10920;
  RTPPacket *pack;
  RTPSessionParams sessparams;
  RTPUDPv4TransmissionParams transparams;
  int iStack_107fc;
  int iStack_107f8;
  int num;
  int i;
  int status;
  string ipstr;
  undefined1 auStack_107c8 [6];
  uint16_t portbase;
  MyRTPSession sess;
  
  MyRTPSession::MyRTPSession((MyRTPSession *)auStack_107c8);
  std::__cxx11::string::string((string *)&i);
  poVar2 = std::operator<<((ostream *)&std::cout,"Enter local portbase:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,(ushort *)(ipstr.field_2._M_local_buf + 0xe));
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Number of seconds you wish to wait:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,&iStack_107fc);
  jrtplib::RTPUDPv4TransmissionParams::RTPUDPv4TransmissionParams
            ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety);
  jrtplib::RTPSessionParams::RTPSessionParams((RTPSessionParams *)&pack);
  jrtplib::RTPSessionParams::SetOwnTimestampUnit((RTPSessionParams *)&pack,0.000125);
  jrtplib::RTPSessionParams::SetAcceptOwnPackets((RTPSessionParams *)&pack,true);
  jrtplib::RTPUDPv4TransmissionParams::SetPortbase
            ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety,ipstr.field_2._14_2_);
  num = jrtplib::RTPSession::Create
                  ((RTPSession *)auStack_107c8,(RTPSessionParams *)&pack,
                   (RTPTransmissionParams *)&sessparams.m_needThreadSafety,IPv4UDPProto);
  checkerror(num);
  for (iStack_107f8 = 1; iStack_107f8 <= iStack_107fc; iStack_107f8 = iStack_107f8 + 1) {
    jrtplib::RTPSession::BeginDataAccess((RTPSession *)auStack_107c8);
    bVar1 = jrtplib::RTPSession::GotoFirstSourceWithData((RTPSession *)auStack_107c8);
    if (bVar1) {
      do {
        while (pRStack_10920 = jrtplib::RTPSession::GetNextPacket((RTPSession *)auStack_107c8),
              pRStack_10920 != (RTPPacket *)0x0) {
          printf("Got packet !\n");
          jrtplib::RTPSession::DeletePacket((RTPSession *)auStack_107c8,pRStack_10920);
        }
        bVar1 = jrtplib::RTPSession::GotoNextSourceWithData((RTPSession *)auStack_107c8);
      } while (bVar1);
    }
    jrtplib::RTPSession::EndDataAccess((RTPSession *)auStack_107c8);
    num = jrtplib::RTPSession::Poll((RTPSession *)auStack_107c8);
    checkerror(num);
    jrtplib::RTPTime::RTPTime(&RStack_10928,1,0);
    jrtplib::RTPTime::Wait(&RStack_10928);
  }
  jrtplib::RTPTime::RTPTime(&RStack_10930,10,0);
  jrtplib::RTPSession::BYEDestroy((RTPSession *)auStack_107c8,&RStack_10930,(void *)0x0,0);
  jrtplib::RTPSessionParams::~RTPSessionParams((RTPSessionParams *)&pack);
  jrtplib::RTPUDPv4TransmissionParams::~RTPUDPv4TransmissionParams
            ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety);
  std::__cxx11::string::~string((string *)&i);
  MyRTPSession::~MyRTPSession((MyRTPSession *)auStack_107c8);
  return 0;
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	MyRTPSession sess;
	uint16_t portbase;
	std::string ipstr;
	int status,i,num;

        // First, we'll ask for the necessary information
		
	std::cout << "Enter local portbase:" << std::endl;
	std::cin >> portbase;
	std::cout << std::endl;
	
	std::cout << std::endl;
	std::cout << "Number of seconds you wish to wait:" << std::endl;
	std::cin >> num;
	
	// Now, we'll create a RTP session, set the destination
	// and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be just use 8000 samples per second.
	sessparams.SetOwnTimestampUnit(1.0/8000.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		sess.BeginDataAccess();
		
		// check incoming packets
		if (sess.GotoFirstSourceWithData())
		{
			do
			{
				RTPPacket *pack;
				
				while ((pack = sess.GetNextPacket()) != NULL)
				{
					// You can examine the data here
					printf("Got packet !\n");
					
					// we don't longer need the packet, so
					// we'll delete it
					sess.DeletePacket(pack);
				}
			} while (sess.GotoNextSourceWithData());
		}
		
		sess.EndDataAccess();

#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}